

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessbackend.cpp
# Opt level: O1

QByteArray * __thiscall
QNetworkAccessBackend::rawHeader
          (QByteArray *__return_storage_ptr__,QNetworkAccessBackend *this,QByteArray *header)

{
  QAnyStringView headerName;
  
  headerName.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)(header->d).ptr;
  headerName.m_size = (header->d).size;
  QNetworkReply::rawHeader
            (__return_storage_ptr__,*(QNetworkReply **)(*(long *)(*(long *)(this + 8) + 0xa0) + 8),
             headerName);
  return __return_storage_ptr__;
}

Assistant:

QByteArray QNetworkAccessBackend::rawHeader(const QByteArray &header) const
{
    return d_func()->m_reply->q_func()->rawHeader(header);
}